

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O1

int dotalk(void)

{
  byte *pbVar1;
  monst *pmVar2;
  permonst *ppVar3;
  level *lev;
  boolean bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  ulong in_RAX;
  obj *poVar8;
  monst *pmVar9;
  int iVar10;
  char *pcVar11;
  char *line;
  int iVar12;
  long lVar13;
  schar dy;
  schar dx;
  undefined8 uStack_38;
  
  bVar4 = flags.soundok;
  flags.soundok = '\x01';
  uStack_38 = in_RAX;
  if ((youmonst.data)->msound == '\0') {
    pcVar11 = mons_mname(youmonst.data);
    pcVar11 = an(pcVar11);
    line = "As %s, you cannot speak.";
LAB_002469cc:
    pline(line,pcVar11);
  }
  else {
    if (u.uprops[0x22].intrinsic == 0) {
      if ((u._1052_1_ & 1) == 0) {
        if ((u._1052_1_ & 2) == 0) {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             (poVar8 = shop_object(u.ux,u.uy), poVar8 != (obj *)0x0)) {
            price_quote(poVar8);
            flags.soundok = bVar4;
            return 1;
          }
          uStack_38._0_5_ = CONCAT14(bVar4,(undefined4)uStack_38);
          iVar12 = -1;
          iVar10 = 0;
          do {
            lVar13 = -1;
            do {
              if ((int)lVar13 == 0 && iVar12 == 0) {
                if (u.usteed != (monst *)0x0) {
                  iVar10 = iVar10 + 1;
                  uStack_38._0_6_ = CONCAT15(1,(int5)uStack_38);
                  uStack_38 = (ulong)(uint6)uStack_38;
                }
              }
              else {
                pmVar9 = level->monsters[(long)u.ux + (long)iVar12][u.uy + lVar13];
                if ((pmVar9 == (monst *)0x0) || ((pmVar9->field_0x61 & 2) != 0)) {
                  pmVar9 = (monst *)0x0;
                }
                if (pmVar9 != (monst *)0x0) {
                  if (pmVar9->wormno == '\0') {
                    if (((viz_array[pmVar9->my][pmVar9->mx] & 2U) != 0) ||
                       ((((u.uprops[0x1e].intrinsic == 0 &&
                          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                        (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                         (((viz_array[pmVar9->my][pmVar9->mx] & 1U) != 0 &&
                          ((pmVar9->data->mflags3 & 0x200) != 0)))))))) goto LAB_00246bbd;
LAB_00246c0d:
                    if (((((pmVar9->data->mflags1 & 0x10000) != 0) ||
                         ((poVar8 = which_armor(pmVar9,4), poVar8 != (obj *)0x0 &&
                          (poVar8 = which_armor(pmVar9,4), poVar8->otyp == 0x4f)))) ||
                        ((((u.uprops[0x1e].intrinsic == 0 &&
                           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                          (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                           ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                             (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                             youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                          (iVar6 = dist2((int)pmVar9->mx,(int)pmVar9->my,(int)u.ux,(int)u.uy),
                          0x40 < iVar6)))))) &&
                       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                        (bVar4 = match_warn_of_mon(pmVar9), bVar4 == '\0')))) goto LAB_00246d5f;
                  }
                  else {
                    bVar4 = worm_known(level,pmVar9);
                    if (bVar4 == '\0') goto LAB_00246c0d;
LAB_00246bbd:
                    uVar7 = *(uint *)&pmVar9->field_0x60;
                    if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                       (u.uprops[0xc].extrinsic == 0)) {
                      if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                      goto LAB_00246bff;
                      goto LAB_00246c0d;
                    }
                    if ((uVar7 & 0x280) != 0) goto LAB_00246c0d;
LAB_00246bff:
                    if ((u._1052_1_ & 0x20) != 0) goto LAB_00246c0d;
                  }
                  iVar10 = iVar10 + 1;
                  uStack_38 = CONCAT17((char)iVar12,CONCAT16((char)lVar13,(uint6)uStack_38));
                  uStack_38 = CONCAT26(uStack_38._6_2_,(uint6)uStack_38) & 0xffff00ffffffffff;
                }
              }
LAB_00246d5f:
              lVar13 = lVar13 + 1;
            } while ((int)lVar13 != 2);
            iVar12 = iVar12 + 1;
          } while (iVar12 != 2);
          if (((iVar10 != 1) || (iflags.paranoid_chat != '\0')) &&
             (iVar10 = getdir("Talk to whom? (in what direction)",(schar *)((long)&uStack_38 + 7),
                              (schar *)((long)&uStack_38 + 6),(schar *)((long)&uStack_38 + 5)),
             iVar10 == 0)) {
            iVar10 = 0;
            goto LAB_00246e28;
          }
          lev = level;
          bVar4 = uStack_38._4_1_;
          if ('\0' < uStack_38._5_1_ && u.usteed != (monst *)0x0) {
            pmVar9 = u.usteed;
            if ((*(uint *)&(u.usteed)->field_0x60 & 0xc0000) == 0x40000) {
LAB_00246de2:
              iVar10 = domonnoise(pmVar9);
              flags.soundok = bVar4;
              return iVar10;
            }
            pcVar11 = "Your steed remains silent...";
            goto LAB_00246a15;
          }
          if (uStack_38._5_1_ != '\0') {
            pcVar11 = "down";
            if (uStack_38._5_1_ < '\0') {
              pcVar11 = "up";
            }
            line = "They won\'t hear you %s there.";
            goto LAB_002469cc;
          }
          if (uStack_38._7_1_ == '\0' && uStack_38._6_1_ == '\0') {
            pcVar11 = "Talking to yourself is a bad habit for a dungeoneer.";
            goto LAB_00246a15;
          }
          pmVar2 = level->monsters[(long)u.ux + (long)uStack_38._7_1_]
                   [(long)u.uy + (long)uStack_38._6_1_];
          pmVar9 = (monst *)0x0;
          if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
            pmVar9 = pmVar2;
          }
          if (pmVar9 == (monst *)0x0) {
            flags.soundok = uStack_38._4_1_;
            return 0;
          }
          uVar7 = *(uint *)&pmVar9->field_0x60;
          if ((char)uVar7 < '\0') {
            flags.soundok = uStack_38._4_1_;
            return 0;
          }
          if ((byte)(pmVar9->m_ap_type - 1) < 2) {
            flags.soundok = uStack_38._4_1_;
            return 0;
          }
          if (((byte)(uVar7 >> 0x1c) & 1) != 0 || (uVar7 & 0xc0000) == 0x40000) {
            pbVar1 = (byte *)((long)&pmVar9->mstrategy + 3);
            *pbVar1 = *pbVar1 & 0xcf;
            if ((pmVar9->mtame == '\0') || (pmVar9->meating == 0)) {
              if (urole.malenum == 0x15d) {
                ppVar3 = pmVar9->data;
                if (((pmVar9->mtame == '\0') && ((uVar7 & 0x400000) == 0)) &&
                   (((ppVar3 == mons + 0x5c || ppVar3 == mons + 0x5e) ||
                    (ppVar3 == mons + 0x5a || ppVar3 == mons + 0x5b)) || ppVar3 == mons + 0x5f)) {
                  uVar7 = rnl((int)CONCAT71((int7)((ulong)lev >> 8),ppVar3 != mons + 0x5b));
                  l_monnam(pmVar9);
                  pline("You attempt to soothe the %s with chittering sounds.");
                  if (uVar7 < 2) {
                    tamedog(pmVar9,(obj *)0x0);
                  }
                  else if (uVar7 < 9) {
                    pmVar9->field_0x62 = pmVar9->field_0x62 | 0x40;
                    set_malign(pmVar9);
                  }
                  else {
                    pcVar11 = Monnam(pmVar9);
                    pline("%s unfortunately ignores your overtures.",pcVar11);
                  }
                  iVar10 = 1;
                  goto LAB_00246e28;
                }
              }
              goto LAB_00246de2;
            }
            if (pmVar9->wormno == '\0') {
              if (((viz_array[pmVar9->my][pmVar9->mx] & 2U) != 0) ||
                 ((((((u.uprops[0x1e].intrinsic == 0 &&
                      ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                    ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                   ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                  (((viz_array[pmVar9->my][pmVar9->mx] & 1U) != 0 &&
                   ((pmVar9->data->mflags3 & 0x200) != 0)))))) goto LAB_0024733c;
LAB_0024738a:
              if (((((pmVar9->data->mflags1 & 0x10000) != 0) ||
                   ((poVar8 = which_armor(pmVar9,4), poVar8 != (obj *)0x0 &&
                    (poVar8 = which_armor(pmVar9,4), poVar8->otyp == 0x4f)))) ||
                  ((((u.uprops[0x1e].intrinsic == 0 &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                     ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                       (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                       youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                   (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                    (iVar10 = dist2((int)pmVar9->mx,(int)pmVar9->my,(int)u.ux,(int)u.uy),
                    0x40 < iVar10)))))) &&
                 (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                  (bVar4 = match_warn_of_mon(pmVar9), bVar4 == '\0')))) {
                map_invisible(pmVar9->mx,pmVar9->my);
              }
            }
            else {
              bVar4 = worm_known(lev,pmVar9);
              if (bVar4 == '\0') goto LAB_0024738a;
LAB_0024733c:
              uVar7 = *(uint *)&pmVar9->field_0x60;
              if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                 (u.uprops[0xc].extrinsic == 0)) {
                if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                goto LAB_0024737c;
                goto LAB_0024738a;
              }
              if ((uVar7 & 0x280) != 0) goto LAB_0024738a;
LAB_0024737c:
              if ((u._1052_1_ & 0x20) != 0) goto LAB_0024738a;
            }
            pcVar11 = Monnam(pmVar9);
            iVar10 = 0;
            pline("%s is eating noisily.",pcVar11);
LAB_00246e28:
            flags.soundok = uStack_38._4_1_;
            return iVar10;
          }
          if (pmVar9->wormno == '\0') {
            if (((viz_array[pmVar9->my][pmVar9->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 (((viz_array[pmVar9->my][pmVar9->mx] & 1U) != 0 &&
                  ((pmVar9->data->mflags3 & 0x200) != 0)))))))) goto LAB_00247115;
LAB_00247163:
            if (((((pmVar9->data->mflags1 & 0x10000) != 0) ||
                 ((poVar8 = which_armor(pmVar9,4), poVar8 != (obj *)0x0 &&
                  (poVar8 = which_armor(pmVar9,4), poVar8->otyp == 0x4f)))) ||
                ((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                   ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                     (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                     youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                 (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                  (iVar10 = dist2((int)pmVar9->mx,(int)pmVar9->my,(int)u.ux,(int)u.uy),
                  0x40 < iVar10)))))) &&
               (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                (bVar5 = match_warn_of_mon(pmVar9), bVar5 == '\0')))) {
              flags.soundok = bVar4;
              return 0;
            }
          }
          else {
            bVar5 = worm_known(level,pmVar9);
            if (bVar5 == '\0') goto LAB_00247163;
LAB_00247115:
            uVar7 = *(uint *)&pmVar9->field_0x60;
            if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
               (u.uprops[0xc].extrinsic == 0)) {
              if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
              goto LAB_00247155;
              goto LAB_00247163;
            }
            if ((uVar7 & 0x280) != 0) goto LAB_00247163;
LAB_00247155:
            if ((u._1052_1_ & 0x20) != 0) goto LAB_00247163;
          }
          pcVar11 = Monnam(pmVar9);
          line = "%s seems not to notice you.";
          goto LAB_002469cc;
        }
        pcVar11 = "Your speech is unintelligible underwater.";
      }
      else {
        pcVar11 = "They won\'t hear you out there.";
      }
    }
    else {
      pcVar11 = "You can\'t speak.  You\'re choking!";
    }
LAB_00246a15:
    pline(pcVar11);
  }
  flags.soundok = bVar4;
  return 0;
}

Assistant:

int dotalk(void)
{
    int result;
    boolean save_soundok = flags.soundok;
    flags.soundok = 1;	/* always allow sounds while chatting */
    result = dochat();
    flags.soundok = save_soundok;
    return result;
}